

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::RecordSet::Decode(RecordSet *this,KDataStream *stream)

{
  pointer puVar1;
  KUINT16 KVar2;
  KException *this_00;
  KUINT8 i;
  byte bVar3;
  allocator<char> local_49;
  KUINT8 ui8Val;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar2) {
    puVar1 = (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RecID);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RecSetSerialNum);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16RecLen);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16RecCnt);
    KVar2 = this->m_ui16RecLen;
    ui8Val = '\0';
    for (bVar3 = 0; bVar3 < (byte)((char)KVar2 - 0xcU); bVar3 = bVar3 + 1) {
      KDataStream::Read(stream,&ui8Val);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->m_vui8RecVals,&ui8Val);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ui8Val,"Decode",&local_49);
  KException::KException(this_00,(KString *)&ui8Val,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void RecordSet::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECORD_SET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui8RecVals.clear();

    stream >> m_ui32RecID
           >> m_ui32RecSetSerialNum
           >> m_ui16RecLen
           >> m_ui16RecCnt;

    KUINT8 ui8LenOfRecVal = m_ui16RecLen - RECORD_SET_SIZE;

    KUINT8 ui8Val = 0;

    // This data also includes any padding that may exist.
    for( KUINT8 i = 0; i < ui8LenOfRecVal; ++i )
    {
        stream >> ui8Val;
        m_vui8RecVals.push_back( ui8Val );
    }
}